

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O2

void mcmrsrv(mcmcxdef *cctx,ushort siz,mcmon clinum,mclhd loadhd)

{
  mcmcx1def *ctx;
  int e;
  mcmodef *pmVar1;
  errcxdef *ctx_00;
  mcmon glb;
  
  ctx = cctx->mcmcxgl;
  pmVar1 = mcmoal(ctx,&glb);
  if (pmVar1 == (mcmodef *)0x0) {
    ctx_00 = ctx->mcmcxerr;
    e = 0xe;
  }
  else {
    (pmVar1->mcmoloc).mcmolocl = loadhd;
    pmVar1->mcmoflg = 0;
    pmVar1->mcmosiz = siz;
    mcmcliexp(cctx,clinum);
    if (cctx->mcmcxmtb[clinum >> 8][(ulong)clinum & 0xff] == 0xffff) {
      cctx->mcmcxmtb[clinum >> 8][(ulong)clinum & 0xff] = glb;
      return;
    }
    ctx_00 = ctx->mcmcxerr;
    e = 9;
  }
  errsigf(ctx_00,"TADS",e);
}

Assistant:

void mcmrsrv(mcmcxdef *cctx, ushort siz, mcmon clinum, mclhd loadhd)
{
    mcmcx1def *ctx = cctx->mcmcxgl;                       /* global context */
    mcmon      glb;                       /* global object number allocated */
    mcmodef   *o;
    
    MCMCLICTX(cctx);
    MCMGLBCTX(ctx);
    
    o = mcmoal(ctx, &glb);                       /* get a new object header */
    if (!o) errsig(ctx->mcmcxerr, ERR_NOHDR);     /* can't get a new header */
    
    o->mcmoldh = loadhd;
    o->mcmoflg = 0;
    o->mcmosiz = siz;
    
    mcmcliexp(cctx, clinum);
    if (mcmc2g(cctx, clinum) != MCMONINV)
        errsig(ctx->mcmcxerr, ERR_CLIUSE);
    
    cctx->mcmcxmtb[clinum >> 8][clinum & 255] = glb;
}